

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_4,_2>,_tcu::Matrix<double,_2,_4>_>::call
          (unary<tcu::Matrix<double,_4,_2>,_tcu::Matrix<double,_2,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  Matrix<double,_2,_4> arg;
  Matrix<double,_4,_2> result;
  Matrix<double,_4,_2> MStack_e8;
  Matrix<double,_2,_4> local_a8;
  Matrix<double,_4,_2> local_68;
  
  tcu::Matrix<double,_4,_2>::Matrix(&local_68);
  tcu::Matrix<double,_2,_4>::Matrix(&local_a8);
  unpack<tcu::Matrix<double,_2,_4>_>::get(argument_src,&local_a8);
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&MStack_e8,&local_a8);
  tcu::Matrix<double,_4,_2>::operator=(&local_68,&MStack_e8);
  pack<tcu::Matrix<double,_4,_2>_>::set(result_dst,&local_68);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}